

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hpp
# Opt level: O3

void __thiscall
rc::detail::Any::
AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AnyImpl
          (AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IAnyImpl)._vptr_IAnyImpl = (_func_int **)&PTR_get_001b20e8;
  pcVar2 = (this->m_value)._M_dataplus._M_p;
  paVar1 = &(this->m_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

AnyImpl(ValueT &&value)
      : m_value(std::forward<ValueT>(value)) {}